

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

bool __thiscall senjo::UCIAdapter::QuitCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  Output local_20;
  char *params_local;
  
  params_local = params;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar1) {
    Output::Output(&local_20,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::Quit_abi_cxx11_);
    Output::~Output(&local_20);
    Output::Output(&local_20,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Stop engine and terminate program.");
    Output::~Output(&local_20);
  }
  else {
    (*this->engine->_vptr_ChessEngine[0x1b])();
    Thread::Join(&this->thread);
  }
  return !bVar1;
}

Assistant:

bool UCIAdapter::QuitCommand(const char *params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Quit;
    Output() << "Stop engine and terminate program.";
    return false;
  }
  engine->Quit();
  thread.Join();
  return true;
}